

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O0

string * __thiscall
sqlcheck::PatternTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,sqlcheck *this,PatternType *pattern_type)

{
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  sqlcheck *local_18;
  PatternType *pattern_type_local;
  
  local_18 = this;
  pattern_type_local = (PatternType *)__return_storage_ptr__;
  switch(*(undefined4 *)this) {
  case 0:
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"INVALID",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"PHYSICAL_DATABASE_DESIGN ANTI-PATTERN",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"LOGICAL_DATABASE_DESIGN ANTI-PATTERN",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"QUERY ANTI-PATTERN",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"APPLICATION ANTI-PATTERN",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PatternTypeToString(const PatternType& pattern_type){

  switch (pattern_type) {
    case PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN:
      return "PHYSICAL_DATABASE_DESIGN ANTI-PATTERN";
    case PATTERN_TYPE_LOGICAL_DATABASE_DESIGN:
      return "LOGICAL_DATABASE_DESIGN ANTI-PATTERN";
    case PATTERN_TYPE_QUERY:
      return "QUERY ANTI-PATTERN";
    case PATTERN_TYPE_APPLICATION:
      return "APPLICATION ANTI-PATTERN";

    case PATTERN_TYPE_INVALID:
    default:
      return "INVALID";
  }

}